

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O1

void sk_proxy_close(Socket *s)

{
  (**(code **)((s[-0x20].vt)->plug + 8))();
  sk_addr_free((SockAddr *)s[-0x1c].vt);
  sk_addr_free((SockAddr *)s[-0x1e].vt);
  proxy_negotiator_cleanup((ProxySocket *)(s + -0x21));
  bufchain_clear((bufchain *)(s + -9));
  safefree((ProxySocket *)(s + -0x21));
  return;
}

Assistant:

static void sk_proxy_close (Socket *s)
{
    ProxySocket *ps = container_of(s, ProxySocket, sock);

    sk_close(ps->sub_socket);
    sk_addr_free(ps->proxy_addr);
    sk_addr_free(ps->remote_addr);
    proxy_negotiator_cleanup(ps);
    bufchain_clear(&ps->output_from_negotiator);
    sfree(ps);
}